

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseCompoundLiteralOrCastExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ostream *poVar4;
  CastExpressionSyntax *pCVar5;
  CastExpressionSyntax *castExpr;
  IndexType closeParenTkIdx;
  TypeNameSyntax *typeName;
  IndexType openParenTkIdx;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  openParenTkIdx = (IndexType)expr;
  expr_local = (ExpressionSyntax **)this;
  pSVar3 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar3);
  if (SVar2 == OpenParenToken) {
    typeName = (TypeNameSyntax *)consume(this);
    closeParenTkIdx = 0;
    bVar1 = parseTypeName(this,(TypeNameSyntax **)&closeParenTkIdx);
    if (bVar1) {
      bVar1 = match(this,CloseParenToken,(IndexType *)&castExpr);
      if (bVar1) {
        pSVar3 = peek(this,1);
        SVar2 = SyntaxToken::kind(pSVar3);
        if (SVar2 == OpenBraceToken) {
          this_local._7_1_ =
               parseCompoundLiteral_AtOpenBrace
                         (this,(ExpressionSyntax **)openParenTkIdx,(IndexType)typeName,
                          (TypeNameSyntax *)closeParenTkIdx,(IndexType)castExpr);
        }
        else {
          pCVar5 = makeNode<psy::C::CastExpressionSyntax>(this);
          *(CastExpressionSyntax **)openParenTkIdx = pCVar5;
          pCVar5->openParenTkIdx_ = (IndexType)typeName;
          pCVar5->typeName_ = (TypeNameSyntax *)closeParenTkIdx;
          pCVar5->closeParenTkIdx_ = (IndexType)castExpr;
          this_local._7_1_ = parseExpressionWithPrecedenceCast(this,&pCVar5->expr_);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x487);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"assert failure: `(\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseCompoundLiteralOrCastExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken,
                  return false,
                  "assert failure: `('");

    auto openParenTkIdx = consume();
    TypeNameSyntax* typeName = nullptr;
    if (!parseTypeName(typeName))
        return false;

    LexedTokens::IndexType closeParenTkIdx;
    if (!match(SyntaxKind::CloseParenToken, &closeParenTkIdx))
        return false;

    if (peek().kind() == SyntaxKind::OpenBraceToken)
        return parseCompoundLiteral_AtOpenBrace(expr,
                                                openParenTkIdx,
                                                typeName,
                                                closeParenTkIdx);

    auto castExpr = makeNode<CastExpressionSyntax>();
    expr = castExpr;
    castExpr->openParenTkIdx_ = openParenTkIdx;
    castExpr->typeName_ = typeName;
    castExpr->closeParenTkIdx_ = closeParenTkIdx;
    return parseExpressionWithPrecedenceCast(castExpr->expr_);
}